

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

void heap_insert(heap_t *p,uint entry)

{
  uint uVar1;
  uint uVar2;
  vec_int_t *pvVar3;
  vec_uint_t *pvVar4;
  sdbl_t *psVar5;
  uint uVar6;
  int *piVar7;
  uint *puVar8;
  char *__function;
  char *__file;
  char *__assertion;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  pvVar3 = p->indices;
  uVar1 = pvVar3->size;
  uVar11 = (ulong)uVar1;
  uVar10 = entry + 1;
  if (uVar1 < uVar10) {
    pvVar3->size = uVar10;
    if (pvVar3->cap < uVar10) {
      piVar7 = (int *)realloc(pvVar3->data,(ulong)uVar10 << 2);
      pvVar3->data = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                      ,0x5e,"void vec_int_resize(vec_int_t *, unsigned int)");
      }
      pvVar3->cap = uVar10;
    }
    pvVar3 = p->indices;
    if (uVar1 < pvVar3->size) {
      piVar7 = pvVar3->data;
      do {
        piVar7[uVar11] = -1;
        uVar11 = uVar11 + 1;
      } while (uVar11 < pvVar3->size);
    }
  }
  pvVar3 = p->indices;
  if ((entry < pvVar3->size) && (-1 < pvVar3->data[entry])) {
    __assert_fail("!heap_in_heap(p, entry)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/heap.h"
                  ,0x7f,"void heap_insert(heap_t *, unsigned int)");
  }
  if (pvVar3->size <= entry) goto LAB_0054f6b2;
  pvVar4 = p->data;
  pvVar3->data[entry] = pvVar4->size;
  uVar10 = pvVar4->cap;
  if (pvVar4->size == uVar10) {
    if (uVar10 < 0x10) {
      puVar8 = (uint *)realloc(pvVar4->data,0x40);
      pvVar4->data = puVar8;
      uVar10 = 0x10;
      if (puVar8 == (uint *)0x0) {
LAB_0054f72e:
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
      }
    }
    else {
      if ((int)uVar10 < 1) goto LAB_0054f5a0;
      puVar8 = (uint *)realloc(pvVar4->data,(ulong)uVar10 * 8);
      pvVar4->data = puVar8;
      if (puVar8 == (uint *)0x0) goto LAB_0054f72e;
      uVar10 = uVar10 * 2;
    }
    pvVar4->cap = uVar10;
  }
LAB_0054f5a0:
  pvVar4->data[pvVar4->size] = entry;
  pvVar4->size = pvVar4->size + 1;
  pvVar3 = p->indices;
  if (pvVar3->size <= entry) {
    __assert_fail("i >= 0 && i < p->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                  ,0x7e,"int vec_int_at(vec_int_t *, unsigned int)");
  }
  piVar7 = pvVar3->data;
  uVar10 = piVar7[entry];
  uVar11 = (ulong)uVar10;
  pvVar4 = p->data;
  if (pvVar4->size <= uVar10) {
LAB_0054f67c:
    __assertion = "idx >= 0 && idx < p->size";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
    ;
    __function = "unsigned int vec_uint_at(vec_uint_t *, unsigned int)";
LAB_0054f6a8:
    __assert_fail(__assertion,__file,0x85,__function);
  }
  puVar8 = pvVar4->data;
  uVar1 = puVar8[uVar11];
  if (uVar10 != 0) {
    do {
      uVar6 = (uint)uVar11;
      uVar9 = uVar6 - 1 >> 1;
      if (pvVar4->size <= uVar9) goto LAB_0054f67c;
      uVar10 = p->weights->size;
      if (uVar10 <= uVar1) {
LAB_0054f693:
        __assertion = "i >= 0 && i < p->size";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_sdbl.h"
        ;
        __function = "sdbl_t vec_sdbl_at(vec_sdbl_t *, unsigned int)";
        goto LAB_0054f6a8;
      }
      uVar2 = puVar8[uVar9];
      if (uVar10 <= uVar2) goto LAB_0054f693;
      psVar5 = p->weights->data;
      uVar10 = uVar6;
      if (psVar5[uVar1] <= psVar5[uVar2]) break;
      if (pvVar4->size <= uVar6) goto LAB_0054f6d1;
      puVar8[uVar11] = uVar2;
      if (pvVar4->size <= uVar9) goto LAB_0054f67c;
      if (pvVar3->size <= puVar8[uVar9]) goto LAB_0054f6b2;
      piVar7[puVar8[uVar9]] = uVar6;
      uVar11 = (ulong)uVar9;
      uVar10 = uVar9;
    } while (1 < uVar6 - 1);
  }
  if (pvVar4->size <= uVar10) {
LAB_0054f6d1:
    __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                  ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
  }
  puVar8[uVar10] = uVar1;
  if (uVar1 < pvVar3->size) {
    piVar7[uVar1] = uVar10;
    return;
  }
LAB_0054f6b2:
  __assert_fail("(i >= 0) && (i < vec_int_size(p))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                ,0xa6,"void vec_int_assign(vec_int_t *, unsigned int, int)");
}

Assistant:

static inline void heap_insert(heap_t *p, unsigned entry)
{
    if (vec_int_size(p->indices) < entry + 1) {
        unsigned old_size = vec_int_size(p->indices);
        unsigned i;
        int e;
        vec_int_resize(p->indices, entry + 1);
        vec_int_foreach_start(p->indices, e, i, old_size)
            vec_int_assign(p->indices, i, -1);
    }
    assert(!heap_in_heap(p, entry));
    vec_int_assign(p->indices, entry, (int) vec_uint_size(p->data));
    vec_uint_push_back(p->data, entry);
    heap_percolate_up(p, (unsigned) vec_int_at(p->indices, entry));
}